

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  TreeNode *this;
  Solution *this_00;
  ListNode *this_01;
  string t3String;
  string t2String;
  string t1String;
  ListNode l2;
  ListNode l1;
  string test;
  TreeNode t3;
  TreeNode t2;
  TreeNode t1;
  TreeNode root;
  undefined1 *local_230;
  long local_228;
  undefined1 local_220 [16];
  undefined1 *local_210;
  long local_208;
  undefined1 local_200 [16];
  undefined1 *local_1f0;
  long local_1e8;
  undefined1 local_1e0 [16];
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  ListNode local_f0;
  ListNode local_e0;
  undefined1 *local_d0;
  long local_c8;
  undefined1 local_c0 [16];
  TreeNode local_b0;
  TreeNode local_90;
  TreeNode local_70;
  TreeNode local_50;
  
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,"[1,2,3,4,5,6,7,8,9,null,10,11,null,12]","");
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_110,local_d0,local_d0 + local_c8);
  TreeNode::TreeNode(&local_50,&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  local_1f0 = local_1e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"[1,2,3,4]","");
  local_210 = local_200;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"[2,1,3,null,4,null,7]","");
  local_230 = local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"[1,2,3,null,4]","");
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_130,local_1f0,local_1f0 + local_1e8);
  TreeNode::TreeNode(&local_70,&local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_150,local_210,local_210 + local_208);
  TreeNode::TreeNode(&local_90,&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_170,local_230,local_230 + local_228);
  TreeNode::TreeNode(&local_b0,&local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  this = (TreeNode *)operator_new(0x20);
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_190,local_230,local_230 + local_228);
  TreeNode::TreeNode(this,&local_190);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p);
  }
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"[5]","");
  ListNode::ListNode(&local_e0,&local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p);
  }
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"[5,5]","");
  ListNode::ListNode(&local_f0,&local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  this_00 = (Solution *)operator_new(1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  this_01 = Solution::addTwoNumbers(this_00,&local_e0,&local_f0);
  TreeNode::destroy(this);
  if (this_01 != (ListNode *)0x0) {
    ListNode::traverse(this_01);
  }
  ListNode::destory(this_01);
  operator_delete(this_00);
  if (local_230 != local_220) {
    operator_delete(local_230);
  }
  if (local_210 != local_200) {
    operator_delete(local_210);
  }
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  return 0;
}

Assistant:

int main() {
    string test = "[1,2,3,4,5,6,7,8,9,null,10,11,null,12]";
    TreeNode root(test);

    string t1String = "[1,2,3,4]";
    string t2String = "[2,1,3,null,4,null,7]";
    string t3String = "[1,2,3,null,4]";
    TreeNode t1(t1String);
    TreeNode t2(t2String);
    TreeNode t3(t3String);
    TreeNode *t4 = new TreeNode(t3String);

    ListNode l1("[5]");
    ListNode l2("[5,5]");


    Solution *s = new Solution();
    cout << endl;
    ListNode *r = s->addTwoNumbers(&l1, &l2);


    t4->destroy();
    if (r != NULL) {
        r->traverse();
    }
    r->destory();
    delete s;

}